

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

char_class_type
boost::xpressive::cpp_regex_traits<char>::
lookup_classname_impl_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 end)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x110) {
      return 0;
    }
    bVar2 = compare_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (*(char_type **)((long)&char_class(unsigned_long)::s_char_class_map + lVar3),
                       begin,end);
    lVar1 = lVar3 + 0x10;
  } while (!bVar2);
  return *(char_class_type *)((long)&DAT_00186138 + lVar3);
}

Assistant:

static char_class_type lookup_classname_impl_(FwdIter begin, FwdIter end)
    {
        // find the classname
        typedef cpp_regex_traits<Char> this_t;
        for(std::size_t j = 0; 0 != this_t::char_class(j).class_name_; ++j)
        {
            if(this_t::compare_(this_t::char_class(j).class_name_, begin, end))
            {
                return this_t::char_class(j).class_type_;
            }
        }
        return 0;
    }